

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void uv__udp_sendmsg(uv_udp_t *handle)

{
  long *plVar1;
  int *piVar2;
  bool bVar3;
  long local_70;
  ssize_t size;
  msghdr h;
  QUEUE *q;
  uv_udp_send_t *req;
  uv_udp_t *handle_local;
  
  do {
    if (handle->write_queue == (void **)handle->write_queue[0]) {
      return;
    }
    plVar1 = (long *)handle->write_queue[0];
    h._48_8_ = plVar1;
    if (plVar1 == (long *)0x0) {
      __assert_fail("q != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/udp.c"
                    ,0xe0,"void uv__udp_sendmsg(uv_udp_t *)");
    }
    if (plVar1 == (long *)0x50) {
      __assert_fail("req != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/udp.c"
                    ,0xe3,"void uv__udp_sendmsg(uv_udp_t *)");
    }
    memset(&size,0,0x38);
    size = (ssize_t)(plVar1 + 2);
    h.msg_name._0_4_ = 0x10;
    if ((short)plVar1[2] == 10) {
      h.msg_name._0_4_ = 0x1c;
    }
    h._8_8_ = plVar1[0x13];
    h.msg_iov = (iovec *)(ulong)*(uint *)(plVar1 + 0x12);
    do {
      local_70 = sendmsg((handle->io_watcher).fd,(msghdr *)&size,0);
      bVar3 = false;
      if (local_70 == -1) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
    if (local_70 == -1) {
      piVar2 = __errno_location();
      if (*piVar2 == 0xb) {
        return;
      }
      piVar2 = __errno_location();
      if (*piVar2 == 0xb) {
        return;
      }
    }
    if (local_70 == -1) {
      piVar2 = __errno_location();
      local_70 = (long)-*piVar2;
    }
    plVar1[0x14] = local_70;
    *(long *)plVar1[1] = *plVar1;
    *(long *)(*plVar1 + 8) = plVar1[1];
    *plVar1 = (long)handle->write_completed_queue;
    plVar1[1] = (long)handle->write_completed_queue[1];
    *(long **)plVar1[1] = plVar1;
    handle->write_completed_queue[1] = plVar1;
    uv__io_feed(handle->loop,&handle->io_watcher);
  } while( true );
}

Assistant:

static void uv__udp_sendmsg(uv_udp_t* handle) {
  uv_udp_send_t* req;
  QUEUE* q;
  struct msghdr h;
  ssize_t size;

  while (!QUEUE_EMPTY(&handle->write_queue)) {
    q = QUEUE_HEAD(&handle->write_queue);
    assert(q != NULL);

    req = QUEUE_DATA(q, uv_udp_send_t, queue);
    assert(req != NULL);

    memset(&h, 0, sizeof h);
    if (req->addr.ss_family == AF_UNSPEC) {
      h.msg_name = NULL;
      h.msg_namelen = 0;
    } else {
      h.msg_name = &req->addr;
      if (req->addr.ss_family == AF_INET6)
        h.msg_namelen = sizeof(struct sockaddr_in6);
      else if (req->addr.ss_family == AF_INET)
        h.msg_namelen = sizeof(struct sockaddr_in);
      else if (req->addr.ss_family == AF_UNIX)
        h.msg_namelen = sizeof(struct sockaddr_un);
      else {
        assert(0 && "unsupported address family");
        abort();
      }
    }
    h.msg_iov = (struct iovec*) req->bufs;
    h.msg_iovlen = req->nbufs;

    do {
      size = sendmsg(handle->io_watcher.fd, &h, 0);
    } while (size == -1 && errno == EINTR);

    if (size == -1) {
      if (errno == EAGAIN || errno == EWOULDBLOCK || errno == ENOBUFS)
        break;
    }

    req->status = (size == -1 ? UV__ERR(errno) : size);

    /* Sending a datagram is an atomic operation: either all data
     * is written or nothing is (and EMSGSIZE is raised). That is
     * why we don't handle partial writes. Just pop the request
     * off the write queue and onto the completed queue, done.
     */
    QUEUE_REMOVE(&req->queue);
    QUEUE_INSERT_TAIL(&handle->write_completed_queue, &req->queue);
    uv__io_feed(handle->loop, &handle->io_watcher);
  }
}